

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error TT_Get_MM_Var(TT_Face face,FT_MM_Var **master)

{
  FT_Long size;
  FT_Long size_00;
  size_t __n;
  byte bVar1;
  FT_UShort FVar2;
  int iVar3;
  uint uVar4;
  FT_Error FVar5;
  FT_MM_Var *pFVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  FT_Var_Named_Style *pFVar11;
  FT_Pointer pvVar12;
  FT_Fixed *pFVar13;
  uchar *__dest;
  long lVar14;
  bool bVar15;
  uint local_134;
  undefined4 local_130;
  FT_UInt n;
  FT_UInt strid;
  FT_Int dummy2;
  FT_Int dummy1;
  FT_Int found;
  SFNT_Service sfnt;
  FT_ULong offset;
  GX_FVar_Axis axis_rec;
  FT_Bool need_init;
  FT_Offset next_name_size;
  FT_Offset next_coords_size;
  FT_Offset namedstyle_size;
  FT_Offset axis_size;
  FT_Offset axis_flags_size;
  FT_Offset mmvar_size;
  FT_UShort *axis_flags;
  FT_UInt num_axes;
  FT_UInt num_instances;
  FT_Bool usePsName;
  GX_FVar_Head fvar_head;
  FT_Var_Named_Style *ns;
  FT_Fixed *c;
  FT_Var_Axis *a;
  FT_String *next_name;
  FT_Fixed *nsc;
  FT_Fixed *next_coords;
  FT_MM_Var *mmvar;
  FT_UInt j;
  FT_UInt i;
  FT_ULong fvar_start;
  FT_Error error;
  FT_ULong table_len;
  FT_Memory memory;
  FT_Stream stream;
  FT_MM_Var **master_local;
  TT_Face face_local;
  
  memory = (FT_Memory)(face->root).stream;
  table_len = (FT_ULong)(face->root).memory;
  fvar_start._4_4_ = 0;
  _j = 0;
  bVar15 = false;
  axis_rec._39_1_ = (face->blend != (GX_Blend)0x0 ^ 0xffU) & 1;
  stream = (FT_Stream)master;
  master_local = (FT_MM_Var **)face;
  if (axis_rec._39_1_ == 0) {
    axis_flags._4_4_ = face->blend->num_axis;
  }
  else {
    fvar_start._4_4_ =
         (*face->goto_table)(face,0x67766172,(FT_Stream)memory,(FT_ULong *)&stack0xffffffffffffffd0)
    ;
    if (fvar_start._4_4_ != 0) {
      iVar3 = (*(code *)master_local[0x68])(master_local,0x43464632,memory,&stack0xffffffffffffffd0)
      ;
      if (iVar3 != 0) {
        return iVar3;
      }
      fvar_start._4_4_ = 0;
    }
    fvar_start._4_4_ =
         (*(code *)master_local[0x68])(master_local,0x66766172,memory,&stack0xffffffffffffffd0);
    if (fvar_start._4_4_ != 0) {
      return fvar_start._4_4_;
    }
    _j = FT_Stream_Pos((FT_Stream)memory);
    fvar_start._4_4_ =
         FT_Stream_ReadFields((FT_Stream)memory,TT_Get_MM_Var::fvar_fields,&num_instances);
    if (fvar_start._4_4_ != 0) {
      return fvar_start._4_4_;
    }
    bVar15 = (uint)fvar_head.offsetToData == (uint)fvar_head.version._2_2_ * 4 + 6;
    pFVar6 = (FT_MM_Var *)
             ft_mem_alloc((FT_Memory)table_len,0x90,(FT_Error *)((long)&fvar_start + 4));
    master_local[0x90] = pFVar6;
    if (fvar_start._4_4_ != 0) {
      return fvar_start._4_4_;
    }
    axis_flags._4_4_ = (FT_UInt)fvar_head.version._2_2_;
  }
  uVar4 = (uint)((ulong)master_local[3] >> 0x10) & 0xffff;
  uVar7 = (ulong)axis_flags._4_4_ * 2 + 7 & 0xfffffffffffffff8;
  lVar8 = (ulong)axis_flags._4_4_ * 0x30;
  lVar9 = (ulong)uVar4 * 0x10;
  lVar10 = (ulong)(uVar4 * axis_flags._4_4_) * 8;
  if (axis_rec._39_1_ != '\0') {
    *(ulong *)(master_local[0x90] + 1) =
         uVar7 + 0x20 + lVar8 + lVar9 + lVar10 + (ulong)(axis_flags._4_4_ * 5);
    size._0_4_ = master_local[0x90][1].num_axis;
    size._4_4_ = master_local[0x90][1].num_designs;
    pFVar11 = (FT_Var_Named_Style *)
              ft_mem_alloc((FT_Memory)table_len,size,(FT_Error *)((long)&fvar_start + 4));
    if (fvar_start._4_4_ != 0) {
      return fvar_start._4_4_;
    }
    master_local[0x90]->namedstyle = pFVar11;
    *(FT_UInt *)&pFVar11->coords = axis_flags._4_4_;
    *(undefined4 *)((long)&pFVar11->coords + 4) = 0xffffffff;
    pFVar11->strid = uVar4;
    mmvar_size = (FT_Offset)(pFVar11 + 2);
    pFVar11[1].coords = (FT_Fixed *)((long)&((FT_Var_Named_Style *)mmvar_size)->coords + uVar7);
    *(FT_Fixed **)&pFVar11[1].strid = pFVar11[1].coords + (ulong)axis_flags._4_4_ * 6;
    nsc = (FT_Fixed *)(*(long *)&pFVar11[1].strid + lVar9);
    for (mmvar._4_4_ = 0; mmvar._4_4_ < uVar4; mmvar._4_4_ = mmvar._4_4_ + 1) {
      *(FT_Fixed **)(*(long *)&pFVar11[1].strid + (ulong)mmvar._4_4_ * 0x10) = nsc;
      nsc = nsc + axis_flags._4_4_;
    }
    a = (FT_Var_Axis *)(*(long *)&pFVar11[1].strid + lVar9 + lVar10);
    for (mmvar._4_4_ = 0; mmvar._4_4_ < axis_flags._4_4_; mmvar._4_4_ = mmvar._4_4_ + 1) {
      pFVar11[1].coords[(ulong)mmvar._4_4_ * 6] = (FT_Fixed)a;
      a = (FT_Var_Axis *)((long)&a->name + 5);
    }
    FVar5 = FT_Stream_Seek((FT_Stream)memory,_j + (ushort)fvar_head.version);
    if (FVar5 != 0) {
      return FVar5;
    }
    c = pFVar11[1].coords;
    for (mmvar._4_4_ = 0; fvar_start._4_4_ = 0, mmvar._4_4_ < axis_flags._4_4_;
        mmvar._4_4_ = mmvar._4_4_ + 1) {
      FVar5 = FT_Stream_ReadFields((FT_Stream)memory,TT_Get_MM_Var::fvaraxis_fields,&offset);
      if (FVar5 != 0) {
        return FVar5;
      }
      c[4] = offset;
      c[1] = axis_rec.axisTag;
      c[2] = axis_rec.minValue;
      c[3] = axis_rec.defaultValue;
      *(uint *)(c + 5) = (uint)axis_rec.maxValue._2_2_;
      *(char *)*c = (char)((ulong)c[4] >> 0x18);
      *(char *)(*c + 1) = (char)((ulong)c[4] >> 0x10);
      *(char *)(*c + 2) = (char)((ulong)c[4] >> 8);
      *(char *)(*c + 3) = (char)c[4];
      *(undefined1 *)(*c + 4) = 0;
      *(undefined2 *)mmvar_size = (undefined2)axis_rec.maxValue;
      if ((c[2] < c[1]) || (c[3] < c[2])) {
        c[1] = c[2];
        c[3] = c[2];
      }
      c = c + 6;
      mmvar_size = mmvar_size + 2;
    }
    pvVar12 = ft_mem_realloc((FT_Memory)table_len,8,0,(ulong)(axis_flags._4_4_ * uVar4),(void *)0x0,
                             (FT_Error *)((long)&fvar_start + 4));
    *(FT_Pointer *)&master_local[0x90][1].num_namedstyles = pvVar12;
    if (fvar_start._4_4_ != 0) {
      return fvar_start._4_4_;
    }
    if ((fvar_head.version._6_2_ != 0) && (*(char *)&master_local[0x90][1].axis == '\0')) {
      sfnt = (SFNT_Service)FT_Stream_Pos((FT_Stream)memory);
      ft_var_load_avar((TT_Face)master_local);
      fvar_start._4_4_ = FT_Stream_Seek((FT_Stream)memory,(FT_ULong)sfnt);
      if (fvar_start._4_4_ != 0) {
        return fvar_start._4_4_;
      }
    }
    fvar_head._16_8_ = *(undefined8 *)&pFVar11[1].strid;
    next_name = *(FT_String **)&master_local[0x90][1].num_namedstyles;
    for (mmvar._4_4_ = 0; mmvar._4_4_ < fvar_head.version._6_2_; mmvar._4_4_ = mmvar._4_4_ + 1) {
      lVar14 = 4;
      if (bVar15) {
        lVar14 = 6;
      }
      fvar_start._4_4_ =
           FT_Stream_EnterFrame((FT_Stream)memory,lVar14 + (ulong)axis_flags._4_4_ * 4);
      if (fvar_start._4_4_ != 0) {
        return fvar_start._4_4_;
      }
      FVar2 = FT_Stream_GetUShort((FT_Stream)memory);
      *(uint *)(fvar_head._16_8_ + 8) = (uint)FVar2;
      FT_Stream_GetUShort((FT_Stream)memory);
      ns = *(FT_Var_Named_Style **)fvar_head._16_8_;
      for (mmvar._0_4_ = 0; (uint)mmvar < axis_flags._4_4_; mmvar._0_4_ = (uint)mmvar + 1) {
        pFVar13 = (FT_Fixed *)FT_Stream_GetULong((FT_Stream)memory);
        ns->coords = pFVar13;
        ns = (FT_Var_Named_Style *)&ns->strid;
      }
      if (bVar15) {
        FVar2 = FT_Stream_GetUShort((FT_Stream)memory);
        *(uint *)(fvar_head._16_8_ + 0xc) = (uint)FVar2;
      }
      else {
        *(undefined4 *)(fvar_head._16_8_ + 0xc) = 0xffff;
      }
      ft_var_to_normalized
                ((TT_Face)master_local,axis_flags._4_4_,*(FT_Fixed **)fvar_head._16_8_,
                 (FT_Fixed *)next_name);
      next_name = next_name + (ulong)axis_flags._4_4_ * 8;
      FT_Stream_ExitFrame((FT_Stream)memory);
      fvar_head._16_8_ = fvar_head._16_8_ + 0x10;
    }
    if (uVar4 != fvar_head.version._6_2_) {
      _dummy1 = master_local[0x6e];
      local_130 = 0xffffffff;
      bVar1 = (*(code *)_dummy1[7].axis)(master_local,0x11,&strid,&n);
      dummy2 = (FT_Int)bVar1;
      if (dummy2 == 0) {
        bVar1 = (*(code *)_dummy1[7].axis)(master_local,2,&strid,&n);
        dummy2 = (FT_Int)bVar1;
        if (dummy2 != 0) {
          local_130 = 2;
        }
      }
      else {
        local_130 = 0x11;
      }
      if (dummy2 != 0) {
        bVar1 = (*(code *)_dummy1[7].axis)(master_local,6,&strid,&n);
        dummy2 = (FT_Int)bVar1;
        if (dummy2 != 0) {
          fvar_head._16_8_ = *(long *)&pFVar11[1].strid + (ulong)fvar_head.version._6_2_ * 0x10;
          *(undefined4 *)(fvar_head._16_8_ + 8) = local_130;
          *(undefined4 *)(fvar_head._16_8_ + 0xc) = 6;
          c = pFVar11[1].coords;
          ns = *(FT_Var_Named_Style **)fvar_head._16_8_;
          for (mmvar._0_4_ = 0; (uint)mmvar < axis_flags._4_4_; mmvar._0_4_ = (uint)mmvar + 1) {
            ns->coords = (FT_Fixed *)c[2];
            c = c + 6;
            ns = (FT_Var_Named_Style *)&ns->strid;
          }
        }
      }
    }
    ft_var_load_mvar((TT_Face)master_local);
  }
  if ((stream != (FT_Stream)0x0) &&
     (size_00._0_4_ = master_local[0x90][1].num_axis,
     size_00._4_4_ = master_local[0x90][1].num_designs,
     __dest = (uchar *)ft_mem_alloc((FT_Memory)table_len,size_00,(FT_Error *)((long)&fvar_start + 4)
                                   ), fvar_start._4_4_ == 0)) {
    __n._0_4_ = master_local[0x90][1].num_axis;
    __n._4_4_ = master_local[0x90][1].num_designs;
    memcpy(__dest,master_local[0x90]->namedstyle,__n);
    *(uchar **)(__dest + 0x10) = __dest + uVar7 + 0x20;
    *(long *)(__dest + 0x18) = *(long *)(__dest + 0x10) + lVar8;
    nsc = (FT_Fixed *)(*(long *)(__dest + 0x18) + lVar9);
    for (local_134 = 0; local_134 < *(uint *)(__dest + 8); local_134 = local_134 + 1) {
      *(FT_Fixed **)(*(long *)(__dest + 0x18) + (ulong)local_134 * 0x10) = nsc;
      nsc = nsc + axis_flags._4_4_;
    }
    c = *(FT_Fixed **)(__dest + 0x10);
    a = (FT_Var_Axis *)(*(long *)(__dest + 0x18) + lVar9 + lVar10);
    for (local_134 = 0; local_134 < axis_flags._4_4_; local_134 = local_134 + 1) {
      *c = (FT_Fixed)a;
      if (c[4] == 0x77676874) {
        *c = (FT_Fixed)"Weight";
      }
      else if (c[4] == 0x77647468) {
        *c = (FT_Fixed)"Width";
      }
      else if (c[4] == 0x6f70737a) {
        *c = (FT_Fixed)"OpticalSize";
      }
      else if (c[4] == 0x736c6e74) {
        *c = (FT_Fixed)"Slant";
      }
      a = (FT_Var_Axis *)((long)&a->name + 5);
      c = c + 6;
    }
    stream->base = __dest;
  }
  return fvar_start._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Get_MM_Var( TT_Face      face,
                 FT_MM_Var*  *master )
  {
    FT_Stream            stream     = face->root.stream;
    FT_Memory            memory     = face->root.memory;
    FT_ULong             table_len;
    FT_Error             error      = FT_Err_Ok;
    FT_ULong             fvar_start = 0;
    FT_UInt              i, j;
    FT_MM_Var*           mmvar = NULL;
    FT_Fixed*            next_coords;
    FT_Fixed*            nsc;
    FT_String*           next_name;
    FT_Var_Axis*         a;
    FT_Fixed*            c;
    FT_Var_Named_Style*  ns;
    GX_FVar_Head         fvar_head;
    FT_Bool              usePsName  = 0;
    FT_UInt              num_instances;
    FT_UInt              num_axes;
    FT_UShort*           axis_flags;

    FT_Offset  mmvar_size;
    FT_Offset  axis_flags_size;
    FT_Offset  axis_size;
    FT_Offset  namedstyle_size;
    FT_Offset  next_coords_size;
    FT_Offset  next_name_size;

    FT_Bool  need_init;

    static const FT_Frame_Field  fvar_fields[] =
    {

#undef  FT_STRUCTURE
#define FT_STRUCTURE  GX_FVar_Head

      FT_FRAME_START( 16 ),
        FT_FRAME_LONG      ( version ),
        FT_FRAME_USHORT    ( offsetToData ),
        FT_FRAME_SKIP_SHORT,
        FT_FRAME_USHORT    ( axisCount ),
        FT_FRAME_USHORT    ( axisSize ),
        FT_FRAME_USHORT    ( instanceCount ),
        FT_FRAME_USHORT    ( instanceSize ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  fvaraxis_fields[] =
    {

#undef  FT_STRUCTURE
#define FT_STRUCTURE  GX_FVar_Axis

      FT_FRAME_START( 20 ),
        FT_FRAME_ULONG ( axisTag ),
        FT_FRAME_LONG  ( minValue ),
        FT_FRAME_LONG  ( defaultValue ),
        FT_FRAME_LONG  ( maxValue ),
        FT_FRAME_USHORT( flags ),
        FT_FRAME_USHORT( nameID ),
      FT_FRAME_END
    };


    /* read the font data and set up the internal representation */
    /* if not already done                                       */

    need_init = !face->blend;

    if ( need_init )
    {
      FT_TRACE2(( "FVAR " ));

      /* both `fvar' and `gvar' must be present */
      if ( FT_SET_ERROR( face->goto_table( face, TTAG_gvar,
                                           stream, &table_len ) ) )
      {
        /* CFF2 is an alternate to gvar here */
        if ( FT_SET_ERROR( face->goto_table( face, TTAG_CFF2,
                                             stream, &table_len ) ) )
        {
          FT_TRACE1(( "\n"
                      "TT_Get_MM_Var: `gvar' or `CFF2' table is missing\n" ));
          goto Exit;
        }
      }

      if ( FT_SET_ERROR( face->goto_table( face, TTAG_fvar,
                                           stream, &table_len ) ) )
      {
        FT_TRACE1(( "is missing\n" ));
        goto Exit;
      }

      fvar_start = FT_STREAM_POS( );

      /* the validity of the `fvar' header data was already checked */
      /* in function `sfnt_init_face'                               */
      if ( FT_STREAM_READ_FIELDS( fvar_fields, &fvar_head ) )
        goto Exit;

      usePsName = FT_BOOL( fvar_head.instanceSize ==
                           6 + 4 * fvar_head.axisCount );

      FT_TRACE2(( "loaded\n" ));

      FT_TRACE5(( "number of GX style axes: %d\n", fvar_head.axisCount ));

      if ( FT_NEW( face->blend ) )
        goto Exit;

      num_axes = fvar_head.axisCount;
    }
    else
      num_axes = face->blend->num_axis;

    /* `num_instances' holds the number of all named instances, */
    /* including the default instance which might be missing    */
    /* in fvar's table of named instances                       */
    num_instances = (FT_UInt)face->root.style_flags >> 16;

    /* prepare storage area for MM data; this cannot overflow   */
    /* 32-bit arithmetic because of the size limits used in the */
    /* `fvar' table validity check in `sfnt_init_face'          */

    /* the various `*_size' variables, which we also use as     */
    /* offsets into the `mmlen' array, must be multiples of the */
    /* pointer size (except the last one); without such an      */
    /* alignment there might be runtime errors due to           */
    /* misaligned addresses                                     */
#undef  ALIGN_SIZE
#define ALIGN_SIZE( n ) \
          ( ( (n) + sizeof (void*) - 1 ) & ~( sizeof (void*) - 1 ) )

    mmvar_size       = ALIGN_SIZE( sizeof ( FT_MM_Var ) );
    axis_flags_size  = ALIGN_SIZE( num_axes *
                                   sizeof ( FT_UShort ) );
    axis_size        = ALIGN_SIZE( num_axes *
                                   sizeof ( FT_Var_Axis ) );
    namedstyle_size  = ALIGN_SIZE( num_instances *
                                   sizeof ( FT_Var_Named_Style ) );
    next_coords_size = ALIGN_SIZE( num_instances *
                                   num_axes *
                                   sizeof ( FT_Fixed ) );
    next_name_size   = num_axes * 5;

    if ( need_init )
    {
      face->blend->mmvar_len = mmvar_size       +
                               axis_flags_size  +
                               axis_size        +
                               namedstyle_size  +
                               next_coords_size +
                               next_name_size;

      if ( FT_ALLOC( mmvar, face->blend->mmvar_len ) )
        goto Exit;
      face->blend->mmvar = mmvar;

      /* set up pointers and offsets into the `mmvar' array; */
      /* the data gets filled in later on                    */

      mmvar->num_axis =
        num_axes;
      mmvar->num_designs =
        ~0U;                   /* meaningless in this context; each glyph */
                               /* may have a different number of designs  */
                               /* (or tuples, as called by Apple)         */
      mmvar->num_namedstyles =
        num_instances;

      /* alas, no public field in `FT_Var_Axis' for axis flags */
      axis_flags =
        (FT_UShort*)( (char*)mmvar + mmvar_size );
      mmvar->axis =
        (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
      mmvar->namedstyle =
        (FT_Var_Named_Style*)( (char*)mmvar->axis + axis_size );

      next_coords = (FT_Fixed*)( (char*)mmvar->namedstyle +
                                 namedstyle_size );
      for ( i = 0; i < num_instances; i++ )
      {
        mmvar->namedstyle[i].coords  = next_coords;
        next_coords                 += num_axes;
      }

      next_name = (FT_String*)( (char*)mmvar->namedstyle +
                                namedstyle_size + next_coords_size );
      for ( i = 0; i < num_axes; i++ )
      {
        mmvar->axis[i].name  = next_name;
        next_name           += 5;
      }

      /* now fill in the data */

      if ( FT_STREAM_SEEK( fvar_start + fvar_head.offsetToData ) )
        goto Exit;

      a = mmvar->axis;
      for ( i = 0; i < num_axes; i++ )
      {
        GX_FVar_Axis  axis_rec;


        if ( FT_STREAM_READ_FIELDS( fvaraxis_fields, &axis_rec ) )
          goto Exit;
        a->tag     = axis_rec.axisTag;
        a->minimum = axis_rec.minValue;
        a->def     = axis_rec.defaultValue;
        a->maximum = axis_rec.maxValue;
        a->strid   = axis_rec.nameID;

        a->name[0] = (FT_String)(   a->tag >> 24 );
        a->name[1] = (FT_String)( ( a->tag >> 16 ) & 0xFF );
        a->name[2] = (FT_String)( ( a->tag >>  8 ) & 0xFF );
        a->name[3] = (FT_String)( ( a->tag       ) & 0xFF );
        a->name[4] = '\0';

        *axis_flags = axis_rec.flags;

        if ( a->minimum > a->def ||
             a->def > a->maximum )
        {
          FT_TRACE2(( "TT_Get_MM_Var:"
                      " invalid \"%s\" axis record; disabling\n",
                      a->name ));

          a->minimum = a->def;
          a->maximum = a->def;
        }

        FT_TRACE5(( "  \"%s\":"
                    " minimum=%.5f, default=%.5f, maximum=%.5f,"
                    " flags=0x%04X\n",
                    a->name,
                    a->minimum / 65536.0,
                    a->def / 65536.0,
                    a->maximum / 65536.0,
                    *axis_flags ));

        a++;
        axis_flags++;
      }

      FT_TRACE5(( "\n" ));

      /* named instance coordinates are stored as design coordinates; */
      /* we have to convert them to normalized coordinates also       */
      if ( FT_NEW_ARRAY( face->blend->normalized_stylecoords,
                         num_axes * num_instances ) )
        goto Exit;

      if ( fvar_head.instanceCount && !face->blend->avar_loaded )
      {
        FT_ULong  offset = FT_STREAM_POS();


        ft_var_load_avar( face );

        if ( FT_STREAM_SEEK( offset ) )
          goto Exit;
      }

      ns  = mmvar->namedstyle;
      nsc = face->blend->normalized_stylecoords;
      for ( i = 0; i < fvar_head.instanceCount; i++, ns++ )
      {
        /* PostScript names add 2 bytes to the instance record size */
        if ( FT_FRAME_ENTER( ( usePsName ? 6L : 4L ) +
                             4L * num_axes ) )
          goto Exit;

        ns->strid       =    FT_GET_USHORT();
        (void) /* flags = */ FT_GET_USHORT();

        c = ns->coords;
        for ( j = 0; j < num_axes; j++, c++ )
          *c = FT_GET_LONG();

        /* valid psid values are 6, [256;32767], and 0xFFFF */
        if ( usePsName )
          ns->psid = FT_GET_USHORT();
        else
          ns->psid = 0xFFFF;

        ft_var_to_normalized( face, num_axes, ns->coords, nsc );
        nsc += num_axes;

        FT_FRAME_EXIT();
      }

      if ( num_instances != fvar_head.instanceCount )
      {
        SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

        FT_Int   found, dummy1, dummy2;
        FT_UInt  strid = ~0U;


        /* the default instance is missing in array the   */
        /* of named instances; try to synthesize an entry */
        found = sfnt->get_name_id( face,
                                   TT_NAME_ID_TYPOGRAPHIC_SUBFAMILY,
                                   &dummy1,
                                   &dummy2 );
        if ( found )
          strid = TT_NAME_ID_TYPOGRAPHIC_SUBFAMILY;
        else
        {
          found = sfnt->get_name_id( face,
                                     TT_NAME_ID_FONT_SUBFAMILY,
                                     &dummy1,
                                     &dummy2 );
          if ( found )
            strid = TT_NAME_ID_FONT_SUBFAMILY;
        }

        if ( found )
        {
          found = sfnt->get_name_id( face,
                                     TT_NAME_ID_PS_NAME,
                                     &dummy1,
                                     &dummy2 );
          if ( found )
          {
            FT_TRACE5(( "TT_Get_MM_Var:"
                        " Adding default instance to named instances\n" ));

            ns = &mmvar->namedstyle[fvar_head.instanceCount];

            ns->strid = strid;
            ns->psid  = TT_NAME_ID_PS_NAME;

            a = mmvar->axis;
            c = ns->coords;
            for ( j = 0; j < num_axes; j++, a++, c++ )
              *c = a->def;
          }
        }
      }

      ft_var_load_mvar( face );
    }

    /* fill the output array if requested */

    if ( master )
    {
      FT_UInt  n;


      if ( FT_ALLOC( mmvar, face->blend->mmvar_len ) )
        goto Exit;
      FT_MEM_COPY( mmvar, face->blend->mmvar, face->blend->mmvar_len );

      axis_flags =
        (FT_UShort*)( (char*)mmvar + mmvar_size );
      mmvar->axis =
        (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
      mmvar->namedstyle =
        (FT_Var_Named_Style*)( (char*)mmvar->axis+ axis_size );

      next_coords = (FT_Fixed*)( (char*)mmvar->namedstyle +
                                 namedstyle_size );
      for ( n = 0; n < mmvar->num_namedstyles; n++ )
      {
        mmvar->namedstyle[n].coords  = next_coords;
        next_coords                 += num_axes;
      }

      a         = mmvar->axis;
      next_name = (FT_String*)( (char*)mmvar->namedstyle +
                                namedstyle_size + next_coords_size );
      for ( n = 0; n < num_axes; n++ )
      {
        a->name = next_name;

        /* standard PostScript names for some standard apple tags */
        if ( a->tag == TTAG_wght )
          a->name = (char*)"Weight";
        else if ( a->tag == TTAG_wdth )
          a->name = (char*)"Width";
        else if ( a->tag == TTAG_opsz )
          a->name = (char*)"OpticalSize";
        else if ( a->tag == TTAG_slnt )
          a->name = (char*)"Slant";

        next_name += 5;
        a++;
      }

      *master = mmvar;
    }

  Exit:
    return error;
  }